

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyReadTimeUnit(Scl_Tree_t *p)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *__s1;
  char *pUnit;
  Scl_Item_t *pItem;
  Scl_Tree_t *p_local;
  
  pSVar2 = Scl_LibertyRoot(p);
  pUnit = (char *)Scl_LibertyItem(p,pSVar2->Child);
  do {
    if (pUnit == (char *)0x0) {
LAB_004a94b7:
      printf("Libery parser cannot read \"time_unit\".  Assuming   time_unit : \"1ns\".\n");
      return 9;
    }
    iVar1 = Scl_LibertyCompare(p,*(Scl_Pair_t *)(pUnit + 8),"time_unit");
    if (iVar1 == 0) {
      __s1 = Scl_LibertyReadString(p,*(Scl_Pair_t *)(pUnit + 0x10));
      iVar1 = strcmp(__s1,"1ns");
      if (iVar1 == 0) {
        return 9;
      }
      iVar1 = strcmp(__s1,"100ps");
      if (iVar1 == 0) {
        return 10;
      }
      iVar1 = strcmp(__s1,"10ps");
      if (iVar1 == 0) {
        return 0xb;
      }
      iVar1 = strcmp(__s1,"1ps");
      if (iVar1 == 0) {
        return 0xc;
      }
      goto LAB_004a94b7;
    }
    pUnit = (char *)Scl_LibertyItem(p,*(int *)(pUnit + 0x20));
  } while( true );
}

Assistant:

int Scl_LibertyReadTimeUnit( Scl_Tree_t * p )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "time_unit" )
    {
        char * pUnit = Scl_LibertyReadString(p, pItem->Head);
        // 9=1ns, 10=100ps, 11=10ps, 12=1ps
        if ( !strcmp(pUnit, "1ns") )
            return 9;
        if ( !strcmp(pUnit, "100ps") )
            return 10;
        if ( !strcmp(pUnit, "10ps") )
            return 11;
        if ( !strcmp(pUnit, "1ps") )
            return 12;
        break;
    }
    printf( "Libery parser cannot read \"time_unit\".  Assuming   time_unit : \"1ns\".\n" );
    return 9;
}